

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_bool32
drmp3_calculate_seek_points(drmp3 *pMP3,drmp3_uint32 *pSeekPointCount,drmp3_seek_point *pSeekPoints)

{
  code *pcVar1;
  drmp3_bool32 dVar2;
  SDL_AssertState SVar3;
  drmp3_uint32 dVar4;
  uint uVar5;
  ulong uStack_b8;
  drmp3_uint32 pcmFramesInCurrentMP3FrameIn_1;
  size_t i;
  SDL_AssertState sdl_assert_state;
  drmp3_uint32 pcmFramesInCurrentMP3FrameIn;
  drmp3_uint32 iSeekPoint;
  drmp3_uint32 iMP3Frame;
  drmp3_uint64 nextTargetPCMFrame;
  drmp3_uint64 dStack_90;
  float runningPCMFrameCountFractionalPart;
  drmp3_uint64 runningPCMFrameCount;
  drmp3__seeking_mp3_frame_info mp3FrameInfo [3];
  drmp3_uint64 pcmFramesBetweenSeekPoints;
  drmp3_uint64 totalPCMFrameCount;
  drmp3_uint64 totalMP3FrameCount;
  drmp3_uint64 currentPCMFrame;
  drmp3_seek_point *pdStack_28;
  drmp3_uint32 seekPointCount;
  drmp3_seek_point *pSeekPoints_local;
  drmp3_uint32 *pSeekPointCount_local;
  drmp3 *pMP3_local;
  
  if (((pMP3 == (drmp3 *)0x0) || (pSeekPointCount == (drmp3_uint32 *)0x0)) ||
     (pSeekPoints == (drmp3_seek_point *)0x0)) {
    pMP3_local._4_4_ = 0;
  }
  else {
    currentPCMFrame._4_4_ = *pSeekPointCount;
    if (currentPCMFrame._4_4_ == SDL_ASSERTION_RETRY) {
      pMP3_local._4_4_ = 0;
    }
    else {
      totalMP3FrameCount = pMP3->currentPCMFrame;
      pdStack_28 = pSeekPoints;
      pSeekPoints_local = (drmp3_seek_point *)pSeekPointCount;
      pSeekPointCount_local = (drmp3_uint32 *)pMP3;
      dVar2 = drmp3_get_mp3_and_pcm_frame_count
                        (pMP3,&totalPCMFrameCount,&pcmFramesBetweenSeekPoints);
      if (dVar2 == 0) {
        pMP3_local._4_4_ = 0;
      }
      else {
        if (totalPCMFrameCount < 3) {
          currentPCMFrame._4_4_ = SDL_ASSERTION_BREAK;
          pdStack_28->seekPosInBytes = 0;
          pdStack_28->pcmFrameIndex = 0;
          pdStack_28->mp3FramesToDiscard = 0;
          pdStack_28->pcmFramesToDiscard = 0;
        }
        else {
          dStack_90 = 0;
          nextTargetPCMFrame._4_4_ = 0;
          if (totalPCMFrameCount - 1 < (ulong)currentPCMFrame._4_4_) {
            currentPCMFrame._4_4_ = (int)totalPCMFrameCount - SDL_ASSERTION_BREAK;
          }
          uVar5 = currentPCMFrame._4_4_ + SDL_ASSERTION_BREAK;
          dVar2 = drmp3_seek_to_start_of_stream((drmp3 *)pSeekPointCount_local);
          if (dVar2 == 0) {
            return 0;
          }
          for (pcmFramesInCurrentMP3FrameIn = 0; pcmFramesInCurrentMP3FrameIn < 3;
              pcmFramesInCurrentMP3FrameIn = pcmFramesInCurrentMP3FrameIn + 1) {
            do {
              if (*(ulong *)(pSeekPointCount_local + 4000) <=
                  *(ulong *)(pSeekPointCount_local + 0xf9a)) goto LAB_00115f5c;
              SVar3 = (*SDL20_ReportAssertion)
                                (&drmp3_calculate_seek_points::sdl_assert_data,
                                 "drmp3_calculate_seek_points",
                                 "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/dr_mp3.h"
                                 ,0x1018);
            } while (SVar3 == SDL_ASSERTION_RETRY);
            if (SVar3 == SDL_ASSERTION_BREAK) {
              pcVar1 = (code *)swi(3);
              dVar2 = (*pcVar1)();
              return dVar2;
            }
LAB_00115f5c:
            mp3FrameInfo[(ulong)pcmFramesInCurrentMP3FrameIn - 1].pcmFrameIndex =
                 *(long *)(pSeekPointCount_local + 0xf9a) - *(long *)(pSeekPointCount_local + 4000);
            mp3FrameInfo[pcmFramesInCurrentMP3FrameIn].bytePos = dStack_90;
            dVar4 = drmp3_decode_next_frame_ex
                              ((drmp3 *)pSeekPointCount_local,(drmp3d_sample_t *)0x0);
            if (dVar4 == 0) {
              return 0;
            }
            drmp3__accumulate_running_pcm_frame_count
                      ((drmp3 *)pSeekPointCount_local,dVar4,&stack0xffffffffffffff70,
                       (float *)((long)&nextTargetPCMFrame + 4));
          }
          _iSeekPoint = 0;
          for (sdl_assert_state = SDL_ASSERTION_RETRY; sdl_assert_state < currentPCMFrame._4_4_;
              sdl_assert_state = sdl_assert_state + SDL_ASSERTION_BREAK) {
            _iSeekPoint = pcmFramesBetweenSeekPoints / uVar5 + _iSeekPoint;
            while (dStack_90 <= _iSeekPoint) {
              for (uStack_b8 = 0; uStack_b8 < 2; uStack_b8 = uStack_b8 + 1) {
                mp3FrameInfo[uStack_b8 - 1].pcmFrameIndex = mp3FrameInfo[uStack_b8].pcmFrameIndex;
                mp3FrameInfo[uStack_b8].bytePos = mp3FrameInfo[uStack_b8 + 1].bytePos;
              }
              mp3FrameInfo[1].pcmFrameIndex =
                   *(long *)(pSeekPointCount_local + 0xf9a) -
                   *(long *)(pSeekPointCount_local + 4000);
              mp3FrameInfo[2].bytePos = dStack_90;
              dVar4 = drmp3_decode_next_frame_ex
                                ((drmp3 *)pSeekPointCount_local,(drmp3d_sample_t *)0x0);
              if (dVar4 == 0) {
                pdStack_28[sdl_assert_state].seekPosInBytes = runningPCMFrameCount;
                pdStack_28[sdl_assert_state].pcmFrameIndex = _iSeekPoint;
                pdStack_28[sdl_assert_state].mp3FramesToDiscard = 2;
                pdStack_28[sdl_assert_state].pcmFramesToDiscard =
                     (short)_iSeekPoint - (short)mp3FrameInfo[1].bytePos;
                goto LAB_001161ec;
              }
              drmp3__accumulate_running_pcm_frame_count
                        ((drmp3 *)pSeekPointCount_local,dVar4,&stack0xffffffffffffff70,
                         (float *)((long)&nextTargetPCMFrame + 4));
            }
            pdStack_28[sdl_assert_state].seekPosInBytes = runningPCMFrameCount;
            pdStack_28[sdl_assert_state].pcmFrameIndex = _iSeekPoint;
            pdStack_28[sdl_assert_state].mp3FramesToDiscard = 2;
            pdStack_28[sdl_assert_state].pcmFramesToDiscard =
                 (short)_iSeekPoint - (short)mp3FrameInfo[1].bytePos;
LAB_001161ec:
          }
          dVar2 = drmp3_seek_to_start_of_stream((drmp3 *)pSeekPointCount_local);
          if (dVar2 == 0) {
            return 0;
          }
          dVar2 = drmp3_seek_to_pcm_frame((drmp3 *)pSeekPointCount_local,totalMP3FrameCount);
          if (dVar2 == 0) {
            return 0;
          }
        }
        *(SDL_AssertState *)&pSeekPoints_local->seekPosInBytes = currentPCMFrame._4_4_;
        pMP3_local._4_4_ = 1;
      }
    }
  }
  return pMP3_local._4_4_;
}

Assistant:

DRMP3_API drmp3_bool32 drmp3_calculate_seek_points(drmp3* pMP3, drmp3_uint32* pSeekPointCount, drmp3_seek_point* pSeekPoints)
{
    drmp3_uint32 seekPointCount;
    drmp3_uint64 currentPCMFrame;
    drmp3_uint64 totalMP3FrameCount;
    drmp3_uint64 totalPCMFrameCount;

    if (pMP3 == NULL || pSeekPointCount == NULL || pSeekPoints == NULL) {
        return DRMP3_FALSE; /* Invalid args. */
    }

    seekPointCount = *pSeekPointCount;
    if (seekPointCount == 0) {
        return DRMP3_FALSE;  /* The client has requested no seek points. Consider this to be invalid arguments since the client has probably not intended this. */
    }

    /* We'll need to seek back to the current sample after calculating the seekpoints so we need to go ahead and grab the current location at the top. */
    currentPCMFrame = pMP3->currentPCMFrame;

    /* We never do more than the total number of MP3 frames and we limit it to 32-bits. */
    if (!drmp3_get_mp3_and_pcm_frame_count(pMP3, &totalMP3FrameCount, &totalPCMFrameCount)) {
        return DRMP3_FALSE;
    }

    /* If there's less than DRMP3_SEEK_LEADING_MP3_FRAMES+1 frames we just report 1 seek point which will be the very start of the stream. */
    if (totalMP3FrameCount < DRMP3_SEEK_LEADING_MP3_FRAMES+1) {
        seekPointCount = 1;
        pSeekPoints[0].seekPosInBytes     = 0;
        pSeekPoints[0].pcmFrameIndex      = 0;
        pSeekPoints[0].mp3FramesToDiscard = 0;
        pSeekPoints[0].pcmFramesToDiscard = 0;
    } else {
        drmp3_uint64 pcmFramesBetweenSeekPoints;
        drmp3__seeking_mp3_frame_info mp3FrameInfo[DRMP3_SEEK_LEADING_MP3_FRAMES+1];
        drmp3_uint64 runningPCMFrameCount = 0;
        float runningPCMFrameCountFractionalPart = 0;
        drmp3_uint64 nextTargetPCMFrame;
        drmp3_uint32 iMP3Frame;
        drmp3_uint32 iSeekPoint;

        if (seekPointCount > totalMP3FrameCount-1) {
            seekPointCount = (drmp3_uint32)totalMP3FrameCount-1;
        }

        pcmFramesBetweenSeekPoints = totalPCMFrameCount / (seekPointCount+1);

        /*
        Here is where we actually calculate the seek points. We need to start by moving the start of the stream. We then enumerate over each
        MP3 frame.
        */
        if (!drmp3_seek_to_start_of_stream(pMP3)) {
            return DRMP3_FALSE;
        }

        /*
        We need to cache the byte positions of the previous MP3 frames. As a new MP3 frame is iterated, we cycle the byte positions in this
        array. The value in the first item in this array is the byte position that will be reported in the next seek point.
        */

        /* We need to initialize the array of MP3 byte positions for the leading MP3 frames. */
        for (iMP3Frame = 0; iMP3Frame < DRMP3_SEEK_LEADING_MP3_FRAMES+1; ++iMP3Frame) {
            drmp3_uint32 pcmFramesInCurrentMP3FrameIn;

            /* The byte position of the next frame will be the stream's cursor position, minus whatever is sitting in the buffer. */
            DRMP3_ASSERT(pMP3->streamCursor >= pMP3->dataSize);
            mp3FrameInfo[iMP3Frame].bytePos       = pMP3->streamCursor - pMP3->dataSize;
            mp3FrameInfo[iMP3Frame].pcmFrameIndex = runningPCMFrameCount;

            /* We need to get information about this frame so we can know how many samples it contained. */
            pcmFramesInCurrentMP3FrameIn = drmp3_decode_next_frame_ex(pMP3, NULL);
            if (pcmFramesInCurrentMP3FrameIn == 0) {
                return DRMP3_FALSE; /* This should never happen. */
            }

            drmp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
        }

        /*
        At this point we will have extracted the byte positions of the leading MP3 frames. We can now start iterating over each seek point and
        calculate them.
        */
        nextTargetPCMFrame = 0;
        for (iSeekPoint = 0; iSeekPoint < seekPointCount; ++iSeekPoint) {
            nextTargetPCMFrame += pcmFramesBetweenSeekPoints;

            for (;;) {
                if (nextTargetPCMFrame < runningPCMFrameCount) {
                    /* The next seek point is in the current MP3 frame. */
                    pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                    pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                    pSeekPoints[iSeekPoint].mp3FramesToDiscard = DRMP3_SEEK_LEADING_MP3_FRAMES;
                    pSeekPoints[iSeekPoint].pcmFramesToDiscard = (drmp3_uint16)(nextTargetPCMFrame - mp3FrameInfo[DRMP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                    break;
                } else {
                    size_t i;
                    drmp3_uint32 pcmFramesInCurrentMP3FrameIn;

                    /*
                    The next seek point is not in the current MP3 frame, so continue on to the next one. The first thing to do is cycle the cached
                    MP3 frame info.
                    */
                    for (i = 0; i < DRMP3_COUNTOF(mp3FrameInfo)-1; ++i) {
                        mp3FrameInfo[i] = mp3FrameInfo[i+1];
                    }

                    /* Cache previous MP3 frame info. */
                    mp3FrameInfo[DRMP3_COUNTOF(mp3FrameInfo)-1].bytePos       = pMP3->streamCursor - pMP3->dataSize;
                    mp3FrameInfo[DRMP3_COUNTOF(mp3FrameInfo)-1].pcmFrameIndex = runningPCMFrameCount;

                    /*
                    Go to the next MP3 frame. This shouldn't ever fail, but just in case it does we just set the seek point and break. If it happens, it
                    should only ever do it for the last seek point.
                    */
                    pcmFramesInCurrentMP3FrameIn = drmp3_decode_next_frame_ex(pMP3, NULL);
                    if (pcmFramesInCurrentMP3FrameIn == 0) {
                        pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                        pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                        pSeekPoints[iSeekPoint].mp3FramesToDiscard = DRMP3_SEEK_LEADING_MP3_FRAMES;
                        pSeekPoints[iSeekPoint].pcmFramesToDiscard = (drmp3_uint16)(nextTargetPCMFrame - mp3FrameInfo[DRMP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                        break;
                    }

                    drmp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
                }
            }
        }

        /* Finally, we need to seek back to where we were. */
        if (!drmp3_seek_to_start_of_stream(pMP3)) {
            return DRMP3_FALSE;
        }
        if (!drmp3_seek_to_pcm_frame(pMP3, currentPCMFrame)) {
            return DRMP3_FALSE;
        }
    }

    *pSeekPointCount = seekPointCount;
    return DRMP3_TRUE;
}